

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int duckdb_fmt::v6::internal::
    parse_nonnegative_int<char,duckdb_fmt::v6::internal::width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>&>
              (char **begin,char *end,
              width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
              *eh)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  allocator local_39;
  string local_38;
  
  pcVar1 = *begin;
  cVar2 = *pcVar1;
  if (cVar2 == '0') {
    *begin = pcVar1 + 1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar1 = pcVar1 + 1;
      if (0xccccccc < uVar3) {
        uVar3 = 0x80000000;
        goto LAB_01287e51;
      }
      uVar3 = (uVar3 * 10 + (int)cVar2) - 0x30;
      *begin = pcVar1;
    } while ((pcVar1 != end) && (cVar2 = *pcVar1, (byte)(cVar2 - 0x30U) < 10));
    if ((int)uVar3 < 0) {
LAB_01287e51:
      std::__cxx11::string::string((string *)&local_38,"number is too big",&local_39);
      width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
      ::on_error(eh,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}